

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportEvent
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index event_index,Index sig_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  size_type sVar4;
  const_pointer pcVar5;
  undefined1 local_50 [8];
  string_view name;
  Index import_index_local;
  BinaryReaderObjdump *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderObjdump *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  name.size_._4_4_ = import_index;
  PrintDetails(this," - event[%u] sig=%u",(ulong)event_index,(ulong)sig_index);
  _local_50 = BinaryReaderObjdumpBase::GetEventName
                        (&this->super_BinaryReaderObjdumpBase,event_index);
  bVar1 = string_view::empty((string_view *)local_50);
  if (!bVar1) {
    sVar2 = string_view::length((string_view *)local_50);
    pcVar3 = string_view::data((string_view *)local_50);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pcVar3);
  }
  sVar2 = string_view::length((string_view *)&field_name_local.size_);
  pcVar3 = string_view::data((string_view *)&field_name_local.size_);
  sVar4 = string_view::length((string_view *)&this_local);
  pcVar5 = string_view::data((string_view *)&this_local);
  PrintDetails(this," <- %.*s.%.*s\n",sVar2 & 0xffffffff,pcVar3,sVar4 & 0xffffffff,pcVar5);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnImportEvent(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index event_index,
                                          Index sig_index) {
  PrintDetails(" - event[%" PRIindex "] sig=%" PRIindex, event_index,
               sig_index);
  auto name = GetEventName(event_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}